

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O0

void __thiscall
absl::lts_20240722::log_internal::EncodeMessageLength
          (log_internal *this,Span<char> msg,Span<char> *buf)

{
  pointer pcVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type size;
  Span<char> *this_00;
  Span<char> *buf_local;
  Span<char> msg_local;
  
  this_00 = (Span<char> *)msg.len_;
  msg_local.ptr_ = msg.ptr_;
  buf_local = (Span<char> *)this;
  pcVar1 = Span<char>::data((Span<char> *)&buf_local);
  if (pcVar1 != (pointer)0x0) {
    pcVar1 = Span<char>::data(this_00);
    pcVar2 = Span<char>::data((Span<char> *)&buf_local);
    if (pcVar1 < pcVar2) {
      __assert_fail("buf->data() >= msg.data()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/log/internal/proto.cc"
                    ,0x93,
                    "void absl::log_internal::EncodeMessageLength(absl::Span<char>, const absl::Span<char> *)"
                   );
    }
    pcVar1 = Span<char>::data(this_00);
    pcVar2 = Span<char>::data((Span<char> *)&buf_local);
    if (pcVar2 <= pcVar1) {
      pcVar1 = Span<char>::data(this_00);
      pcVar2 = Span<char>::data((Span<char> *)&buf_local);
      sVar3 = Span<char>::size((Span<char> *)&buf_local);
      size = Span<char>::size((Span<char> *)&buf_local);
      anon_unknown_2::EncodeRawVarint
                ((long)pcVar1 - (long)(pcVar2 + sVar3),size,(Span<char> *)&buf_local);
    }
  }
  return;
}

Assistant:

void EncodeMessageLength(absl::Span<char> msg, const absl::Span<char> *buf) {
  if (!msg.data()) return;
  assert(buf->data() >= msg.data());
  if (buf->data() < msg.data()) return;
  EncodeRawVarint(
      static_cast<uint64_t>(buf->data() - (msg.data() + msg.size())),
      msg.size(), &msg);
}